

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::VariablesFbLoadForces(ChBody *this,double factor)

{
  ChVector<double> *__return_storage_ptr__;
  double factor_local;
  ChVector<double> v;
  ChVector<double> local_b8;
  ChVector<double> *local_a0 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_90;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
  local_60 [56];
  
  local_b8.m_data[0] = (double)&this->Xforce;
  factor_local = factor;
  Eigen::operator*(&local_90,&factor_local,(StorageBaseType *)&local_b8);
  ChVariables::Get_fb((ChVectorRef *)&v,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_60,
              (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&v,0,3);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
  ::operator+=(local_60,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)&local_90);
  if ((this->bflags & 0x800) == 0) {
    v.m_data._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])(this->Xtorque).m_data,
                    *(undefined1 (*) [16])(this->gyro).m_data);
    v.m_data[2] = (this->Xtorque).m_data[2] - (this->gyro).m_data[2];
    local_a0[0] = &v;
    Eigen::operator*(&local_90,&factor_local,(StorageBaseType *)local_a0);
    __return_storage_ptr__ = &local_b8;
  }
  else {
    local_b8.m_data[0] = (double)&this->Xtorque;
    Eigen::operator*(&local_90,&factor_local,(StorageBaseType *)&local_b8);
    __return_storage_ptr__ = &v;
  }
  ChVariables::Get_fb((ChVectorRef *)__return_storage_ptr__,(ChVariables *)&this->variables);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_60,
              (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
              __return_storage_ptr__,3,3);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>,-1,1,false>>
  ::operator+=(local_60,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)&local_90);
  return;
}

Assistant:

void ChBody::VariablesFbLoadForces(double factor) {
    // add applied forces to 'fb' vector
    this->variables.Get_fb().segment(0, 3) += factor * Xforce.eigen();

    // add applied torques to 'fb' vector, including gyroscopic torque
    if (this->GetNoGyroTorque())
        this->variables.Get_fb().segment(3, 3) += factor * Xtorque.eigen();
    else
        this->variables.Get_fb().segment(3, 3) += factor * (Xtorque - gyro).eigen();
}